

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

void load_cabal_items(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  CHAR_DATA *pCVar4;
  
  if ((mPort == 9999) && (__stream = fopen("../configs/citems.txt","r"), __stream != (FILE *)0x0)) {
    iVar2 = fread_number((FILE *)__stream);
    while (iVar2 != -1) {
      iVar3 = fread_number((FILE *)__stream);
      pObjIndex = get_obj_index(0);
      obj = create_object(pObjIndex,0);
      pCVar4 = char_list;
      if (iVar3 == 0) {
        for (; pCVar4 != (CHAR_DATA *)0x0; pCVar4 = pCVar4->next) {
          if ((iVar2 == pCVar4->cabal) && (bVar1 = is_cabal_guard(pCVar4), bVar1)) {
            obj_to_char(obj,pCVar4);
          }
        }
      }
      else {
        for (; pCVar4 != (CHAR_DATA *)0x0; pCVar4 = pCVar4->next) {
          if (iVar3 == pCVar4->pIndexData->vnum) {
            obj_to_char(obj,pCVar4);
          }
        }
      }
      iVar2 = fread_number((FILE *)__stream);
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void load_cabal_items(void)
{
	FILE *fp;
	OBJ_DATA *obj;
	CHAR_DATA *mob;

	int inum, vnum;

	if (mPort != 9999)
		return;

	fp = fopen(CABAL_ITEMS_FILE, "r");

	if (!fp)
		return;

	while ((inum = fread_number(fp)) != -1)
	{
		vnum = fread_number(fp);
		obj = create_object(get_obj_index(cabal_table[inum].item_vnum), 0);

		if (!vnum)
		{
			for (mob = char_list; mob; mob = mob->next)
			{
				if (mob->cabal == inum && is_cabal_guard(mob))
					obj_to_char(obj, mob);
			}

			continue;
		}

		for (mob = char_list; mob; mob = mob->next)
		{
			if (mob->pIndexData->vnum == vnum)
				obj_to_char(obj, mob);
		}
	}

	fclose(fp);
}